

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall IR::Instr::CallsAccessor(Instr *this,PropertySymOpnd *methodOpnd)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (methodOpnd == (PropertySymOpnd *)0x0) {
    bVar2 = CallsGetter(this);
    bVar3 = true;
    if (!bVar2) {
      bVar2 = CallsSetter(this);
      return bVar2;
    }
  }
  else {
    if (methodOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xe7b,"(methodOpnd->HasObjTypeSpecFldInfo())",
                         "methodOpnd->HasObjTypeSpecFldInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (methodOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) {
      bVar2 = ObjTypeSpecFldInfo::UsesAccessor(methodOpnd->objTypeSpecFldInfo);
      return bVar2;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Instr::CallsAccessor(IR::PropertySymOpnd * methodOpnd)
{
    if (methodOpnd)
    {
        Assert(methodOpnd->HasObjTypeSpecFldInfo());
        return methodOpnd->UsesAccessor();
    }

    return CallsGetter() || CallsSetter();
}